

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractRoomAction.cpp
# Opt level: O2

ActionResults * __thiscall AbstractRoomAction::Use(AbstractRoomAction *this)

{
  ItemTable *this_00;
  ItemWrapper *this_01;
  ActionResults *this_02;
  itemType local_b4;
  string information;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  information._M_dataplus._M_p = (pointer)&information.field_2;
  information._M_string_length = 0;
  information.field_2._M_local_buf[0] = '\0';
  this_00 = this->itemList;
  local_b4 = Command::getMainItem(this->commands);
  this_01 = ItemTable::getValue(this_00,&local_b4);
  ItemWrapper::getItemName_abi_cxx11_(&local_70,this_01);
  std::operator+(&local_50,"You contemplate using ",&local_70);
  std::operator+(&local_30,&local_50,
                 " but do not see the use. Perhaps you should do or use something else.");
  std::__cxx11::string::operator=((string *)&information,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this_02 = (ActionResults *)operator_new(0x30);
  std::__cxx11::string::string((string *)&local_90,(string *)&information);
  ActionResults::ActionResults(this_02,CURRENT,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&information);
  return this_02;
}

Assistant:

ActionResults * AbstractRoomAction::Open() {

        return new ActionResults(CURRENT, "You can't open that here.");
}